

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afwarp.c
# Opt level: O0

void af_warper_compute_line_best
               (AF_Warper warper,FT_Fixed scale,FT_Pos delta,FT_Pos xx1,FT_Pos xx2,
               AF_WarpScore base_distort,AF_Segment_conflict segments,FT_Int num_segments)

{
  short sVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  FT_Int32 FVar5;
  int iVar6;
  long lVar7;
  AF_WarpScore distort;
  AF_WarpScore score;
  FT_Int idx_1;
  FT_Int idx;
  FT_Pos y;
  FT_Pos y0;
  FT_Pos len;
  FT_Pos w;
  FT_Pos xx1max;
  FT_Pos xx1min;
  AF_WarpScore scores [65];
  FT_Int nn;
  FT_Int idx0;
  FT_Int idx_max;
  FT_Int idx_min;
  AF_WarpScore base_distort_local;
  FT_Pos xx2_local;
  FT_Pos xx1_local;
  FT_Pos delta_local;
  FT_Fixed scale_local;
  AF_Warper warper_local;
  
  for (scores[0x3f] = 0; scores[0x3f] < 0x41; scores[0x3f] = scores[0x3f] + 1) {
    scores[(long)scores[0x3f] + -2] = 0;
  }
  scores[0x40] = (int)xx1 - (int)warper->t1;
  xx1max = warper->x1min;
  w = warper->x1max;
  lVar7 = xx2 - xx1;
  if (xx1max + lVar7 < warper->x2min) {
    xx1max = warper->x2min - lVar7;
  }
  if (warper->x2max < w + lVar7) {
    w = warper->x2max - lVar7;
  }
  distort = (int)xx1max - (int)warper->t1;
  iVar4 = (int)w - (int)warper->t1;
  if (((-1 < distort) && (distort <= iVar4)) && (iVar4 < 0x41)) {
    for (scores[0x3f] = 0; scores[0x3f] < num_segments; scores[0x3f] = scores[0x3f] + 1) {
      sVar1 = segments[scores[0x3f]].max_coord;
      sVar2 = segments[scores[0x3f]].min_coord;
      FVar5 = FT_MulFix_x86_64((int)segments[scores[0x3f]].pos,(FT_Int32)scale);
      _idx_1 = FVar5 + delta + (long)(distort - scores[0x40]);
      for (score = distort; score <= iVar4; score = score + 1) {
        scores[(long)score + -2] =
             scores[(long)score + -2] + af_warper_weights[_idx_1 & 0x3f] * ((int)sVar1 - (int)sVar2)
        ;
        _idx_1 = _idx_1 + 1;
      }
    }
    for (; distort <= iVar4; distort = distort + 1) {
      iVar3 = scores[(long)distort + -2];
      iVar6 = base_distort + (distort - scores[0x40]);
      if ((warper->best_score < iVar3) ||
         ((iVar3 == warper->best_score && (iVar6 < warper->best_distort)))) {
        warper->best_score = iVar3;
        warper->best_distort = iVar6;
        warper->best_scale = scale;
        warper->best_delta = delta + (distort - scores[0x40]);
      }
    }
  }
  return;
}

Assistant:

static void
  af_warper_compute_line_best( AF_Warper     warper,
                               FT_Fixed      scale,
                               FT_Pos        delta,
                               FT_Pos        xx1,
                               FT_Pos        xx2,
                               AF_WarpScore  base_distort,
                               AF_Segment    segments,
                               FT_Int        num_segments )
  {
    FT_Int        idx_min, idx_max, idx0;
    FT_Int        nn;
    AF_WarpScore  scores[65];


    for ( nn = 0; nn < 65; nn++ )
      scores[nn] = 0;

    idx0 = xx1 - warper->t1;

    /* compute minimum and maximum indices */
    {
      FT_Pos  xx1min = warper->x1min;
      FT_Pos  xx1max = warper->x1max;
      FT_Pos  w      = xx2 - xx1;


      if ( xx1min + w < warper->x2min )
        xx1min = warper->x2min - w;

      if ( xx1max + w > warper->x2max )
        xx1max = warper->x2max - w;

      idx_min = xx1min - warper->t1;
      idx_max = xx1max - warper->t1;

      if ( idx_min < 0 || idx_min > idx_max || idx_max > 64 )
      {
        FT_TRACE5(( "invalid indices:\n"
                    "  min=%d max=%d, xx1=%ld xx2=%ld,\n"
                    "  x1min=%ld x1max=%ld, x2min=%ld x2max=%ld\n",
                    idx_min, idx_max, xx1, xx2,
                    warper->x1min, warper->x1max,
                    warper->x2min, warper->x2max ));
        return;
      }
    }

    for ( nn = 0; nn < num_segments; nn++ )
    {
      FT_Pos  len = segments[nn].max_coord - segments[nn].min_coord;
      FT_Pos  y0  = FT_MulFix( segments[nn].pos, scale ) + delta;
      FT_Pos  y   = y0 + ( idx_min - idx0 );
      FT_Int  idx;


      /* score the length of the segments for the given range */
      for ( idx = idx_min; idx <= idx_max; idx++, y++ )
        scores[idx] += af_warper_weights[y & 63] * len;
    }

    /* find best score */
    {
      FT_Int  idx;


      for ( idx = idx_min; idx <= idx_max; idx++ )
      {
        AF_WarpScore  score = scores[idx];
        AF_WarpScore  distort = base_distort + ( idx - idx0 );


        if ( score > warper->best_score         ||
             ( score == warper->best_score    &&
               distort < warper->best_distort ) )
        {
          warper->best_score   = score;
          warper->best_distort = distort;
          warper->best_scale   = scale;
          warper->best_delta   = delta + ( idx - idx0 );
        }
      }
    }
  }